

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O1

size_t draco::GetFileSize(string *file_name)

{
  size_t sVar1;
  unique_ptr<draco::FileReaderInterface,_std::default_delete<draco::FileReaderInterface>_>
  file_reader;
  _Alloc_hider local_10;
  
  FileReaderFactory::OpenReader((string *)&stack0xfffffffffffffff0);
  if ((long *)local_10._M_p == (long *)0x0) {
    sVar1 = 0;
  }
  else {
    sVar1 = (**(code **)(*(long *)local_10._M_p + 0x20))();
  }
  if ((long *)local_10._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_10._M_p + 8))();
  }
  return sVar1;
}

Assistant:

size_t GetFileSize(const std::string &file_name) {
  std::unique_ptr<FileReaderInterface> file_reader =
      FileReaderFactory::OpenReader(file_name);
  if (file_reader == nullptr) {
    return 0;
  }
  return file_reader->GetFileSize();
}